

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_context_reg_write_batch(uc_context *ctx,int *regs,void **vals,int count)

{
  uc_mode mode;
  uc_err uVar1;
  ulong uVar2;
  ulong uVar3;
  context_reg_rw_t cVar4;
  int setpc;
  size_t size;
  int local_44;
  void **local_40;
  size_t local_38;
  
  mode = ctx->mode;
  local_40 = vals;
  cVar4 = find_context_reg_rw(ctx->arch,mode);
  local_44 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = 0;
  }
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      return UC_ERR_OK;
    }
    local_38 = 0xffffffffffffffff;
    uVar1 = (*cVar4.write)(&ctx->field_0x14,mode,regs[uVar3],local_40[uVar3],&local_38,&local_44);
    uVar3 = uVar3 + 1;
  } while (uVar1 == UC_ERR_OK);
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_write_batch(uc_context *ctx, int *regs, void *const *vals,
                                  int count)
{
    reg_write_t reg_write = find_context_reg_rw(ctx->arch, ctx->mode).write;
    void *env = ctx->data;
    int mode = ctx->mode;
    int setpc = 0;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        const void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_write(env, mode, regid, value, &size, &setpc);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}